

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::FirstState<unsigned_char>,unsigned_char,duckdb::FirstFunction<false,true>>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  uchar *idata;
  FirstState<unsigned_char> **states_00;
  UnifiedVectorFormat sdata;
  AggregateUnaryInput input_data;
  UnifiedVectorFormat local_b8;
  UnifiedVectorFormat local_70;
  
  if (input->vector_type == FLAT_VECTOR) {
    if (states->vector_type == FLAT_VECTOR) {
      idata = input->data;
      states_00 = (FirstState<unsigned_char> **)states->data;
      FlatVector::VerifyFlatVector(input);
      UnaryFlatLoop<duckdb::FirstState<unsigned_char>,unsigned_char,duckdb::FirstFunction<false,true>>
                (idata,aggr_input_data,states_00,&input->validity,count);
      return;
    }
  }
  else if ((input->vector_type == CONSTANT_VECTOR) && (states->vector_type == CONSTANT_VECTOR)) {
    local_70.data = (data_ptr_t)&input->validity;
    local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (unsigned_long *)0x0;
    local_70.sel = (SelectionVector *)aggr_input_data;
    FirstFunction<false,true>::
    Operation<unsigned_char,duckdb::FirstState<unsigned_char>,duckdb::FirstFunction<false,true>>
              (*(FirstState<unsigned_char> **)states->data,input->data,
               (AggregateUnaryInput *)&local_70);
    return;
  }
  UnifiedVectorFormat::UnifiedVectorFormat(&local_70);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_b8);
  Vector::ToUnifiedFormat(input,count,&local_70);
  Vector::ToUnifiedFormat(states,count,&local_b8);
  UnaryScatterLoop<duckdb::FirstState<unsigned_char>,unsigned_char,duckdb::FirstFunction<false,true>>
            (local_70.data,aggr_input_data,(FirstState<unsigned_char> **)local_b8.data,local_70.sel,
             local_b8.sel,&local_70.validity,count);
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_b8);
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_70);
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}